

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::init(TextureCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  long lVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  size_type sVar10;
  EVP_PKEY_CTX *ctx_00;
  reference local_600;
  reference local_5c0;
  MessageBuilder local_590;
  int local_410;
  int local_40c;
  int y_1;
  int x_1;
  reference local_288;
  deUint32 *dataPtr_1;
  undefined1 local_278 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texData_1;
  int y;
  int x;
  reference local_d8;
  deUint32 *dataPtr;
  undefined1 local_c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texData;
  Random rnd;
  Functions *gl;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  TextureCase *pTStack_10;
  GLint maxTextureSize;
  TextureCase *this_local;
  undefined4 extraout_var_00;
  
  local_14 = 0;
  pTStack_10 = this;
  pRVar5 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  ctx_00 = (EVP_PKEY_CTX *)&local_14;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0xd33);
  if (0x7f < local_14) {
    RenderCase::init(&this->super_RenderCase,ctx_00);
    pRVar5 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var_00,iVar2);
    de::Random::Random((Random *)
                       &texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,0x3039);
    (**(code **)(lVar6 + 0x6f8))(1,&this->m_textureID);
    (**(code **)(lVar6 + 0xb8))(0xde1,this->m_textureID);
    if (this->m_uploadType == UPLOAD_PBO) {
      (**(code **)(lVar6 + 0x6c8))(1,&this->m_pboID);
      (**(code **)(lVar6 + 0x40))(0x88ec,this->m_pboID);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"TextureCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x438);
    }
    if (this->m_textureType == TEXTURE_FLOAT) {
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&dataPtr + 7));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,0x8000,
                 (allocator<unsigned_int> *)((long)&dataPtr + 7));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&dataPtr + 7));
      if (this->m_uploadType == UPLOAD_CLIENT) {
        local_5c0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,0);
      }
      else {
        local_5c0 = (reference)0x0;
      }
      local_d8 = local_5c0;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&y,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&y,
                          (char (*) [82])
                          "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1)."
                         );
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&y);
      for (texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 0x80;
          texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        for (texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (int)texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0x80;
            texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)texData_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          uVar4 = de::Random::choose<unsigned_int,unsigned_int_const*>
                            ((Random *)
                             &texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (uint *)Stress::(anonymous_namespace)::s_specialFloats,
                             (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE");
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,
                              (long)((texData_1.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                                      0x80 + (int)texData_1.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     ) * 2));
          *pvVar9 = uVar4;
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,
                              (long)((texData_1.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                                      0x80 + (int)texData_1.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     ) * 2 + 1));
          *pvVar9 = 0x3f800000;
        }
      }
      if (this->m_uploadType == UPLOAD_PBO) {
        pcVar1 = *(code **)(lVar6 + 0x150);
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,0);
        (*pcVar1)(0x88ec,sVar10 << 2,pvVar9,0x88e4);
      }
      (**(code **)(lVar6 + 0x1310))(0xde1,0,0x8230,0x80,0x80,0,0x8227,0x1406,local_d8);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"TextureCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x450);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
    }
    else if (this->m_textureType == TEXTURE_DEPTH) {
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&dataPtr_1 + 7));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,0x4000,
                 (allocator<unsigned_int> *)((long)&dataPtr_1 + 7));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&dataPtr_1 + 7));
      if (this->m_uploadType == UPLOAD_CLIENT) {
        local_600 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,0);
      }
      else {
        local_600 = (reference)0x0;
      }
      local_288 = local_600;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&y_1,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&y_1,
                          (char (*) [80])
                          "Creating a 2D depth texture and filling it with special floating point values.\n"
                         );
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [48])"  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&y_1);
      for (local_40c = 0; local_40c < 0x80; local_40c = local_40c + 1) {
        for (local_410 = 0; local_410 < 0x80; local_410 = local_410 + 1) {
          uVar4 = de::Random::choose<unsigned_int,unsigned_int_const*>
                            ((Random *)
                             &texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (uint *)Stress::(anonymous_namespace)::s_specialFloats,
                             (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE");
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,
                              (long)(local_40c * 0x80 + local_410));
          *pvVar9 = uVar4;
        }
      }
      if (this->m_uploadType == UPLOAD_PBO) {
        pcVar1 = *(code **)(lVar6 + 0x150);
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,0);
        (*pcVar1)(0x88ec,sVar10 << 2,pvVar9,0x88e4);
      }
      (**(code **)(lVar6 + 0x1310))(0xde1,0,0x8cac,0x80,0x80,0,0x1902,0x1406,local_288);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x884c,0x884e);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x884d,0x201);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2601);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2601);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"TextureCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x468);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278);
    }
    if (this->m_uploadType == UPLOAD_PBO) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_590,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_590,(char (*) [27])"PBO used for image upload.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_590);
      (**(code **)(lVar6 + 0x40))(0x88ec,0);
      (**(code **)(lVar6 + 0x438))(1,&this->m_pboID);
      this->m_pboID = 0;
    }
    de::Random::~Random((Random *)
                        &texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    return extraout_EAX;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GL_MAX_TEXTURE_SIZE must be at least ",&local_59);
  de::toString<int>(&local_90,&Stress::(anonymous_namespace)::TEST_TEXTURE_SIZE);
  std::operator+(&local_38,&local_58,&local_90);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(12345);

		gl.genTextures(1, &m_textureID);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		if (m_uploadType == UPLOAD_PBO)
		{
			gl.genBuffers(1, &m_pboID);
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pboID);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}

		if (m_textureType == TEXTURE_FLOAT)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*2);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1)." << tcu::TestLog::EndMessage;

			// set green channel to 1.0
			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
			{
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 0] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 1] = 0x3F800000;	// one
			}

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RG32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RG, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else if (m_textureType == TEXTURE_DEPTH)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message
				<< "Creating a 2D depth texture and filling it with special floating point values.\n"
				<< "  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE"
				<< tcu::TestLog::EndMessage;

			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
				texData[x * TEST_TEXTURE_SIZE + y] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_DEPTH_COMPONENT, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else
			DE_ASSERT(false);

		if (m_uploadType == UPLOAD_PBO)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "PBO used for image upload." << tcu::TestLog::EndMessage;

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			gl.deleteBuffers(1, &m_pboID);
			m_pboID = 0;
		}
	}
}